

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract.c
# Opt level: O3

size_t dictionary_get_all_match_lengths(dictionary_t t_dictionary,ucs4_t *word,size_t *match_length)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  long *t_dictionary_00;
  FILE *__stream;
  size_t __len;
  char *__s1;
  char *pcVar4;
  void *pvVar5;
  void *pvVar6;
  ssize_t sVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  dictionary_desc *dictionary;
  ulong uVar15;
  
  if (*t_dictionary == 1) {
    sVar3 = dictionary_datrie_get_all_match_lengths
                      (*(dictionary_t *)((long)t_dictionary + 8),word,match_length);
    return sVar3;
  }
  if (*t_dictionary == 0) {
    sVar3 = dictionary_text_get_all_match_lengths
                      (*(dictionary_t *)((long)t_dictionary + 8),word,match_length);
    return sVar3;
  }
  dictionary_get_all_match_lengths_cold_1();
  t_dictionary_00 = (long *)malloc(0x40);
  *t_dictionary_00 = 0;
  t_dictionary_00[2] = 0;
  __stream = fopen((char *)t_dictionary,"rb");
  iVar2 = fileno(__stream);
  fseek(__stream,0,2);
  __len = ftell(__stream);
  t_dictionary_00[6] = __len;
  *(undefined4 *)(t_dictionary_00 + 7) = 0;
  __s1 = (char *)mmap((void *)0x0,__len,1,2,iVar2,0);
  pcVar4 = __s1;
  if (__s1 == (char *)0xffffffffffffffff) {
    pcVar4 = (char *)0x0;
  }
  t_dictionary_00[5] = (long)pcVar4;
  if (__s1 == (char *)0xffffffffffffffff) {
    *(undefined4 *)(t_dictionary_00 + 7) = 1;
    __s1 = (char *)malloc(__len);
    t_dictionary_00[5] = (long)__s1;
    if (__s1 == (char *)0x0) goto LAB_00102990;
    lseek(iVar2,0,0);
    sVar7 = read(iVar2,__s1,__len);
    if (sVar7 == -1) goto LAB_00102990;
  }
  iVar2 = strncmp(__s1,"OPENCCDATRIE",0xc);
  if (iVar2 == 0) {
    uVar14 = (ulong)*(uint *)(__s1 + 0xc);
    t_dictionary_00[2] = (long)(__s1 + 0x10);
    uVar8 = (ulong)*(uint *)(__s1 + uVar14 * 4 + 0x10);
    pcVar4 = __s1 + uVar8 * 4 + uVar14 * 4 + 0x1c;
    uVar13 = (ulong)*(uint *)(pcVar4 + -8);
    *(uint *)(t_dictionary_00 + 3) = *(uint *)(pcVar4 + -8);
    *(undefined4 *)(t_dictionary_00 + 1) = *(undefined4 *)(pcVar4 + -4);
    *t_dictionary_00 = (long)pcVar4;
    pvVar5 = malloc(uVar13 * 8);
    t_dictionary_00[4] = (long)pvVar5;
    if (uVar13 != 0) {
      lVar1 = uVar14 * 4 + 0x14;
      uVar14 = 0;
      uVar15 = 0;
      do {
        uVar11 = uVar14;
        uVar10 = uVar14;
        if (uVar14 < uVar8) {
          do {
            uVar11 = uVar10;
            if (*(int *)(__s1 + uVar10 * 4 + lVar1) == -1) break;
            uVar10 = uVar10 + 1;
            uVar11 = uVar8;
          } while (uVar8 != uVar10);
        }
        pvVar6 = malloc((uVar11 - uVar14) * 8 + 8);
        *(void **)((long)pvVar5 + uVar15 * 8) = pvVar6;
        lVar12 = uVar11 - uVar14;
        if (lVar12 == 0) {
          lVar9 = 0;
        }
        else {
          lVar9 = 0;
          do {
            *(char **)(*(long *)((long)pvVar5 + uVar15 * 8) + lVar9 * 8) =
                 __s1 + 0x10 + (ulong)*(uint *)(__s1 + lVar9 * 4 + uVar14 * 4 + lVar1) * 4;
            lVar9 = lVar9 + 1;
          } while (lVar12 != lVar9);
          pvVar6 = *(void **)((long)pvVar5 + uVar15 * 8);
          lVar9 = lVar12;
        }
        *(undefined8 *)((long)pvVar6 + lVar12 * 8) = 0;
        uVar14 = uVar14 + lVar9 + 1;
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar13);
    }
    fclose(__stream);
    return (size_t)t_dictionary_00;
  }
LAB_00102990:
  dictionary_datrie_close(t_dictionary_00);
  return 0xffffffffffffffff;
}

Assistant:

size_t dictionary_get_all_match_lengths(dictionary_t t_dictionary, const ucs4_t * word,
		size_t * match_length)
{
	dictionary_desc * dictionary = (dictionary_desc *) t_dictionary;
	switch (dictionary->type)
	{
	case OPENCC_DICTIONARY_TYPE_TEXT:
		return dictionary_text_get_all_match_lengths(dictionary->dict, word, match_length);
		break;
	case OPENCC_DICTIONARY_TYPE_DATRIE:
		return dictionary_datrie_get_all_match_lengths(dictionary->dict, word, match_length);
		break;
	default:
		debug_should_not_be_here();
	}
	return (size_t) -1;
}